

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

double celero::timer::CachePerformanceFrequency(bool quiet)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000039,quiet) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Timer resolution: ");
    std::__cxx11::to_string(&local_30,0.001);
    poVar1 = std::operator<<(poVar1,(string *)&local_30);
    poVar1 = std::operator<<(poVar1," us");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return 0.001;
}

Assistant:

double celero::timer::CachePerformanceFrequency(bool quiet)
{
#ifdef _WIN32
	QueryPerformanceFrequency(&QPCFrequency);
	if(QPCFrequency.QuadPart == 0)
	{
		return 0;
	}

	auto precision = ((1.0 / static_cast<double>(QPCFrequency.QuadPart)) * 1000000.0);
#else
	if(static_cast<double>(std::chrono::high_resolution_clock::period::den) == 0)
	{
		return 0;
	}

	auto precision =
		(static_cast<double>(std::chrono::high_resolution_clock::period::num) / static_cast<double>(std::chrono::high_resolution_clock::period::den))
		* 1000000.0;
#endif

	if(quiet == false)
	{
		std::cout << "Timer resolution: " << std::to_string(precision) << " us" << std::endl;
	}

	return precision;
}